

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O3

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,QLatin1StringView str)

{
  bool bVar1;
  QUtf8 *this_00;
  char *pcVar2;
  char *in_RCX;
  QtPrivate *this_01;
  size_t allocSize;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView in;
  size_t local_150;
  QUtf8 local_138 [256];
  long local_38;
  
  s.m_data = str.m_data;
  this_01 = (QtPrivate *)str.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  s.m_size = (qsizetype)s.m_data;
  bVar1 = QtPrivate::isAscii(this_01,s);
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      encode_string(&((this->d)._M_t.
                      super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
                      .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl)->
                     encoder,(size_t)this_01,'`',s.m_data);
      return;
    }
  }
  else {
    memset(local_138,0xaa,0x100);
    local_150 = 0x100;
    this_00 = local_138;
    if (0x80 < (long)this_01) {
      local_150 = QtPrivate::expectedAllocSize((long)this_01 * 2,0x10);
      if (local_150 == 0) {
        local_150 = (long)this_01 * 2;
      }
      this_00 = (QUtf8 *)malloc(local_150);
      if (this_00 == (QUtf8 *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          qBadAlloc();
        }
        goto LAB_0049eef5;
      }
    }
    in.m_data = in_RCX;
    in.m_size = (qsizetype)s.m_data;
    pcVar2 = QUtf8::convertFromLatin1(this_00,(char *)this_01,in);
    encode_string(&((this->d)._M_t.
                    super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
                    .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl)->encoder
                  ,(long)pcVar2 - (long)this_00,'`',this_00);
    if (this_00 != local_138) {
      QtPrivate::sizedFree(this_00,local_150);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
LAB_0049eef5:
  __stack_chk_fail();
}

Assistant:

void QCborStreamWriter::append(QLatin1StringView str)
{
    // We've got Latin-1 but CBOR wants UTF-8, so check if the string is the
    // common subset (US-ASCII).
    if (QtPrivate::isAscii(str)) {
        // it is plain US-ASCII
        appendTextString(str.latin1(), str.size());
    } else {
        // non-ASCII, convert:
        QVarLengthArray<char> utf8(str.size() * 2); // each L1 char gives at most two U8 units
        const qsizetype written = QUtf8::convertFromLatin1(utf8.data(), str) - utf8.data();
        appendTextString(utf8.data(), written);
    }
}